

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O0

char * PHYSFS_getLastError(void)

{
  PHYSFS_ErrorCode code;
  undefined8 local_18;
  PHYSFS_ErrorCode err;
  
  code = PHYSFS_getLastErrorCode();
  if (code == PHYSFS_ERR_OK) {
    local_18 = (char *)0x0;
  }
  else {
    local_18 = PHYSFS_getErrorByCode(code);
  }
  return local_18;
}

Assistant:

const char *PHYSFS_getLastError(void)
{
    const PHYSFS_ErrorCode err = PHYSFS_getLastErrorCode();
    return (err) ? PHYSFS_getErrorByCode(err) : NULL;
}